

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool tinyusdz::anon_unknown_237::HasInheritsRec
               (uint32_t depth,PrimSpec *primspec,uint32_t max_depth)

{
  bool bVar1;
  PrimMeta *pPVar2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *this;
  reference primspec_00;
  PrimSpec *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *__range2;
  uint32_t max_depth_local;
  PrimSpec *primspec_local;
  uint32_t depth_local;
  
  if (max_depth < depth) {
    primspec_local._7_1_ = false;
  }
  else {
    pPVar2 = PrimSpec::metas(primspec);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPVar2->inherits);
    if (bVar1) {
      primspec_local._7_1_ = true;
    }
    else {
      this = PrimSpec::children(primspec);
      __end2 = ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::begin(this);
      child = (PrimSpec *)
              ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::end(this);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                                         *)&child), bVar1) {
        primspec_00 = __gnu_cxx::
                      __normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                      ::operator*(&__end2);
        bVar1 = HasInheritsRec(depth + 1,primspec_00,max_depth);
        if (bVar1) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<const_tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
        ::operator++(&__end2);
      }
      primspec_local._7_1_ = false;
    }
  }
  return primspec_local._7_1_;
}

Assistant:

bool HasInheritsRec(uint32_t depth, const PrimSpec &primspec,
                    const uint32_t max_depth = 1024 * 128) {
  if (depth > max_depth) {
    // too deep
    return false;
  }

  if (primspec.metas().inherits) {
    return true;
  }

  for (auto &child : primspec.children()) {
    if (HasInheritsRec(depth + 1, child, max_depth)) {
      return true;
    }
  }

  return false;
}